

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbidata.cpp
# Opt level: O3

void __thiscall
icu_63::RBBIDataWrapper::RBBIDataWrapper
          (RBBIDataWrapper *this,RBBIDataHeader *data,EDontAdopt param_2,UErrorCode *status)

{
  (this->fRuleString).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e5ab8;
  (this->fRuleString).fUnion.fStackFields.fLengthAndFlags = 2;
  this->fTrie = (UTrie2 *)0x0;
  this->fUDataMem = (UDataMemory *)0x0;
  this->fHeader = (RBBIDataHeader *)0x0;
  this->fForwardTable = (RBBIStateTable *)0x0;
  this->fReverseTable = (RBBIStateTable *)0x0;
  this->fRuleSource = (UChar *)0x0;
  this->fRuleStatusTable = (int32_t *)0x0;
  LOCK();
  (this->fRefCount).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  this->fDontFreeData = '\x01';
  init(this,(EVP_PKEY_CTX *)data);
  this->fDontFreeData = '\x01';
  return;
}

Assistant:

RBBIDataWrapper::RBBIDataWrapper(const RBBIDataHeader *data, enum EDontAdopt, UErrorCode &status) {
    init0();
    init(data, status);
    fDontFreeData = TRUE;
}